

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconsVisitor.cpp
# Opt level: O0

void __thiscall OpenMD::ZConsVisitor::visit(ZConsVisitor *this,RigidBody *rb)

{
  bool bVar1;
  int iVar2;
  reference ppAVar3;
  string *in_stack_00000030;
  StuntDouble *in_stack_00000038;
  ZConsVisitor *in_stack_00000040;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> atoms;
  string prefix;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *__x;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> local_48;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)0x353ce8);
  RigidBody::getAtoms((RigidBody *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  __x = &local_48;
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator=
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),__x);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~vector
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  ppAVar3 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[](__x,0);
  iVar2 = StuntDouble::getGlobalIndex(&(*ppAVar3)->super_StuntDouble);
  bVar1 = isZconstraint((ZConsVisitor *)prefix.field_2._M_allocated_capacity,
                        prefix._M_string_length._4_4_,(string *)prefix._0_8_);
  if (bVar1) {
    internalVisit(in_stack_00000040,in_stack_00000038,in_stack_00000030);
  }
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~vector
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
             CONCAT44(iVar2,in_stack_ffffffffffffff80));
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void ZConsVisitor::visit(RigidBody* rb) {
    std::string prefix;
    std::vector<Atom*> atoms;

    atoms = rb->getAtoms();

    if (isZconstraint(atoms[0]->getGlobalIndex(), prefix))
      internalVisit(rb, prefix);
  }